

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::perturbMax(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *__return_storage_ptr__,
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *uvec,
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *p_low,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *p_up,
            number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *eps,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *p_delta,Status *stat,int start,int incr)

{
  uint *puVar1;
  pointer pnVar2;
  Real RVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int32_t iVar11;
  undefined4 uVar12;
  bool bVar13;
  int iVar14;
  fpclass_type fVar15;
  pointer pnVar16;
  long lVar17;
  cpp_dec_float<100U,_int,_void> *pcVar18;
  pointer pnVar19;
  cpp_dec_float<100U,_int,_void> *this_00;
  uint uVar20;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar21;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar22;
  long in_FS_OFFSET;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *l_theShift;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  undefined1 local_a58 [72];
  undefined8 local_a10;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_a00;
  cpp_dec_float<100U,_int,_void> local_9f8;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_9a0;
  double local_998;
  undefined8 uStack_990;
  undefined1 local_988 [72];
  undefined8 local_940;
  undefined1 local_938 [72];
  undefined8 local_8f0;
  cpp_dec_float<100U,_int,_void> *local_8e8;
  Random *local_8e0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_8d8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_8d0;
  double local_8c8;
  undefined8 uStack_8c0;
  undefined1 local_8b8 [72];
  undefined8 local_870;
  undefined1 local_868 [16];
  cpp_dec_float<100U,_int,_void> *local_858;
  undefined8 uStack_850;
  undefined1 local_848 [16];
  cpp_dec_float<100U,_int,_void> local_838;
  cpp_dec_float<100U,_int,_void> local_7e8;
  uint local_798 [2];
  uint auStack_790 [2];
  uint local_788 [2];
  uint auStack_780 [2];
  uint local_778 [2];
  uint auStack_770 [2];
  uint local_768 [2];
  undefined8 uStack_760;
  uint local_758 [2];
  uint auStack_750 [2];
  uint local_748 [2];
  uint auStack_740 [2];
  uint local_738 [2];
  uint auStack_730 [2];
  uint local_728 [2];
  undefined8 uStack_720;
  cpp_dec_float<100U,_int,_void> local_718;
  cpp_dec_float<100U,_int,_void> local_6c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_678;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_628;
  undefined1 local_5d8 [80];
  undefined1 local_588 [80];
  cpp_dec_float<100U,_int,_void> local_538;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4e8;
  undefined1 local_498 [80];
  undefined1 local_448 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3f8;
  undefined1 local_3a8 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_358;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308;
  undefined1 local_2b8 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  undefined1 local_1c8 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined5 uStack_f0;
  undefined3 uStack_eb;
  undefined5 uStack_e8;
  undefined8 local_e0;
  cpp_dec_float<100U,_int,_void> local_d8;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined5 uStack_50;
  undefined3 uStack_4b;
  undefined5 uStack_48;
  undefined8 local_40;
  
  local_868._8_8_ = local_868._0_8_;
  pnVar2 = (uvec->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_7e8.fpclass = cpp_dec_float_finite;
  local_7e8.prec_elem = 0x10;
  local_7e8.data._M_elems[0] = 0;
  local_7e8.data._M_elems[1] = 0;
  local_7e8.data._M_elems[2] = 0;
  local_7e8.data._M_elems[3] = 0;
  local_7e8.data._M_elems[4] = 0;
  local_7e8.data._M_elems[5] = 0;
  local_7e8.data._M_elems[6] = 0;
  local_7e8.data._M_elems[7] = 0;
  local_7e8.data._M_elems[8] = 0;
  local_7e8.data._M_elems[9] = 0;
  local_7e8.data._M_elems[10] = 0;
  local_7e8.data._M_elems[0xb] = 0;
  local_7e8.data._M_elems[0xc] = 0;
  local_7e8.data._M_elems[0xd] = 0;
  local_7e8.data._M_elems._56_5_ = 0;
  local_7e8.data._M_elems[0xf]._1_3_ = 0;
  local_7e8.exp = 0;
  local_7e8.neg = false;
  local_a10._0_4_ = cpp_dec_float_finite;
  local_a10._4_4_ = 0x10;
  local_a58._0_4_ = 0;
  local_a58._4_4_ = 0;
  local_a58._8_4_ = 0;
  local_a58._12_4_ = 0;
  local_a58._16_4_ = 0;
  local_a58._20_4_ = 0;
  local_a58._24_4_ = 0;
  local_a58._28_4_ = 0;
  local_a58._32_4_ = 0;
  local_a58._36_4_ = 0;
  local_a58._40_4_ = 0;
  local_a58._44_4_ = 0;
  local_a58._48_4_ = 0;
  local_a58._52_4_ = 0;
  local_a58._56_5_ = 0;
  local_a58._61_3_ = 0;
  local_a58._64_4_ = 0;
  local_a58[0x44] = false;
  local_a00 = uvec;
  local_9a0 = this;
  local_8e8 = &__return_storage_ptr__->m_backend;
  local_8d8 = p_low;
  local_8d0 = p_up;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)local_a58,10.0);
  if (&local_7e8 != &p_delta->m_backend) {
    local_7e8.data._M_elems._0_8_ = *(undefined8 *)(p_delta->m_backend).data._M_elems;
    local_7e8.data._M_elems._8_8_ = *(undefined8 *)((p_delta->m_backend).data._M_elems + 2);
    local_7e8.data._M_elems._16_8_ = *(undefined8 *)((p_delta->m_backend).data._M_elems + 4);
    local_7e8.data._M_elems._24_8_ = *(undefined8 *)((p_delta->m_backend).data._M_elems + 6);
    local_7e8.data._M_elems._32_8_ = *(undefined8 *)((p_delta->m_backend).data._M_elems + 8);
    local_7e8.data._M_elems._40_8_ = *(undefined8 *)((p_delta->m_backend).data._M_elems + 10);
    local_7e8.data._M_elems._48_8_ = *(undefined8 *)((p_delta->m_backend).data._M_elems + 0xc);
    uVar4 = *(undefined8 *)((p_delta->m_backend).data._M_elems + 0xe);
    local_7e8.data._M_elems._56_5_ = SUB85(uVar4,0);
    local_7e8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
    local_7e8.exp = (p_delta->m_backend).exp;
    local_7e8.neg = (p_delta->m_backend).neg;
    local_7e8.fpclass = (p_delta->m_backend).fpclass;
    local_7e8.prec_elem = (p_delta->m_backend).prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
            (&local_7e8,(cpp_dec_float<100U,_int,_void> *)local_a58);
  local_838.fpclass = cpp_dec_float_finite;
  local_838.prec_elem = 0x10;
  local_838.data._M_elems[0] = 0;
  local_838.data._M_elems[1] = 0;
  local_838.data._M_elems[2] = 0;
  local_838.data._M_elems[3] = 0;
  local_838.data._M_elems[4] = 0;
  local_838.data._M_elems[5] = 0;
  local_838.data._M_elems[6] = 0;
  local_838.data._M_elems[7] = 0;
  local_838.data._M_elems[8] = 0;
  local_838.data._M_elems[9] = 0;
  local_838.data._M_elems[10] = 0;
  local_838.data._M_elems[0xb] = 0;
  local_838.data._M_elems[0xc] = 0;
  local_838.data._M_elems[0xd] = 0;
  local_838.data._M_elems._56_5_ = 0;
  local_838.data._M_elems[0xf]._1_3_ = 0;
  local_838.exp = 0;
  local_838.neg = false;
  local_a10 = 3.39519326554444e-313;
  local_a58._0_4_ = 0;
  local_a58._4_4_ = 0;
  local_a58._8_4_ = 0;
  local_a58._12_4_ = 0;
  local_a58._16_4_ = 0;
  local_a58._20_4_ = 0;
  local_a58._24_4_ = 0;
  local_a58._28_4_ = 0;
  local_a58._32_4_ = 0;
  local_a58._36_4_ = 0;
  local_a58._40_4_ = 0;
  local_a58._44_4_ = 0;
  local_a58._48_4_ = 0;
  local_a58._52_4_ = 0;
  local_a58._56_5_ = 0;
  local_a58._61_3_ = 0;
  local_a58._64_4_ = 0;
  local_a58[0x44] = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)local_a58,100.0);
  if (&local_838 != &p_delta->m_backend) {
    local_838.data._M_elems._0_8_ = *(undefined8 *)(p_delta->m_backend).data._M_elems;
    local_838.data._M_elems._8_8_ = *(undefined8 *)((p_delta->m_backend).data._M_elems + 2);
    local_838.data._M_elems._16_8_ = *(undefined8 *)((p_delta->m_backend).data._M_elems + 4);
    local_838.data._M_elems._24_8_ = *(undefined8 *)((p_delta->m_backend).data._M_elems + 6);
    local_838.data._M_elems._32_8_ = *(undefined8 *)((p_delta->m_backend).data._M_elems + 8);
    local_838.data._M_elems._40_8_ = *(undefined8 *)((p_delta->m_backend).data._M_elems + 10);
    local_838.data._M_elems._48_8_ = *(undefined8 *)((p_delta->m_backend).data._M_elems + 0xc);
    uVar4 = *(undefined8 *)((p_delta->m_backend).data._M_elems + 0xe);
    local_838.data._M_elems._56_5_ = SUB85(uVar4,0);
    local_838.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
    local_838.exp = (p_delta->m_backend).exp;
    local_838.neg = (p_delta->m_backend).neg;
    local_838.fpclass = (p_delta->m_backend).fpclass;
    local_838.prec_elem = (p_delta->m_backend).prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
            (&local_838,(cpp_dec_float<100U,_int,_void> *)local_a58);
  local_870._0_4_ = cpp_dec_float_finite;
  local_870._4_4_ = 0x10;
  local_8b8._0_4_ = 0;
  local_8b8._4_4_ = 0;
  local_8b8._8_4_ = 0;
  local_8b8._12_4_ = 0;
  local_8b8._16_4_ = 0;
  local_8b8._20_4_ = 0;
  local_8b8._24_4_ = 0;
  local_8b8._28_4_ = 0;
  local_8b8._32_4_ = 0;
  local_8b8._36_4_ = 0;
  local_8b8._40_4_ = 0;
  local_8b8._44_4_ = 0;
  local_8b8._48_4_ = 0;
  local_8b8._52_4_ = 0;
  local_8b8._56_5_ = 0;
  local_8b8._61_3_ = 0;
  local_8b8._64_4_ = 0;
  local_8b8[0x44] = false;
  local_940._0_4_ = cpp_dec_float_finite;
  local_940._4_4_ = 0x10;
  local_988._0_4_ = 0;
  local_988._4_4_ = 0;
  local_988._8_4_ = 0;
  local_988._12_4_ = 0;
  local_988._16_4_ = 0;
  local_988._20_4_ = 0;
  local_988._24_4_ = 0;
  local_988._28_4_ = 0;
  local_988._32_4_ = 0;
  local_988._36_4_ = 0;
  local_988._40_4_ = 0;
  local_988._44_4_ = 0;
  local_988._48_4_ = 0;
  local_988._52_4_ = 0;
  local_988._56_5_ = 0;
  local_988._61_3_ = 0;
  local_988._64_4_ = 0;
  local_988[0x44] = false;
  local_8f0._0_4_ = cpp_dec_float_finite;
  local_8f0._4_4_ = 0x10;
  local_938._0_4_ = 0;
  local_938._4_4_ = 0;
  local_938._8_4_ = 0;
  local_938._12_4_ = 0;
  local_938._16_4_ = 0;
  local_938._20_4_ = 0;
  local_938._24_4_ = 0;
  local_938._28_4_ = 0;
  local_938._32_4_ = 0;
  local_938._36_4_ = 0;
  local_938._40_4_ = 0;
  local_938._44_4_ = 0;
  local_938._48_4_ = 0;
  local_938._52_4_ = 0;
  local_938._56_5_ = 0;
  local_938._61_3_ = 0;
  local_938._64_4_ = 0;
  local_938[0x44] = false;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (local_8e8,0,(type *)0x0);
  if (local_9a0->fullPerturbation == true) {
    uVar4 = *(undefined8 *)(p_delta->m_backend).data._M_elems;
    uVar5 = *(undefined8 *)((p_delta->m_backend).data._M_elems + 2);
    uVar6 = *(undefined8 *)((p_delta->m_backend).data._M_elems + 4);
    uVar7 = *(undefined8 *)((p_delta->m_backend).data._M_elems + 6);
    uVar8 = *(undefined8 *)((p_delta->m_backend).data._M_elems + 8);
    uVar9 = *(undefined8 *)((p_delta->m_backend).data._M_elems + 10);
    uVar10 = *(undefined8 *)((p_delta->m_backend).data._M_elems + 0xe);
    *(undefined8 *)((eps->m_backend).data._M_elems + 0xc) =
         *(undefined8 *)((p_delta->m_backend).data._M_elems + 0xc);
    *(undefined8 *)((eps->m_backend).data._M_elems + 0xe) = uVar10;
    *(undefined8 *)((eps->m_backend).data._M_elems + 8) = uVar8;
    *(undefined8 *)((eps->m_backend).data._M_elems + 10) = uVar9;
    *(undefined8 *)((eps->m_backend).data._M_elems + 4) = uVar6;
    *(undefined8 *)((eps->m_backend).data._M_elems + 6) = uVar7;
    *(undefined8 *)(eps->m_backend).data._M_elems = uVar4;
    *(undefined8 *)((eps->m_backend).data._M_elems + 2) = uVar5;
    (eps->m_backend).exp = (p_delta->m_backend).exp;
    (eps->m_backend).neg = (p_delta->m_backend).neg;
    iVar11 = (p_delta->m_backend).prec_elem;
    (eps->m_backend).fpclass = (p_delta->m_backend).fpclass;
    (eps->m_backend).prec_elem = iVar11;
    uVar20 = (int)((ulong)((long)(local_a00->
                                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(local_a00->
                                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333 +
             ~start;
    if (-1 < (int)uVar20) {
      local_8c8 = *(double *)(in_FS_OFFSET + -8);
      local_868._0_8_ = &local_9a0->random;
      uStack_8c0 = 0;
      local_848._8_4_ = DAT_005f4010._8_4_;
      local_848._0_8_ = (ulong)DAT_005f4010 ^ (ulong)local_8c8;
      local_848._12_4_ = DAT_005f4010._12_4_;
      do {
        pUVar21 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)(ulong)uVar20;
        pnVar16 = (local_8d0->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_938._0_8_ = *(undefined8 *)&pnVar16[(long)pUVar21].m_backend.data;
        local_938._8_8_ = *(undefined8 *)((long)&pnVar16[(long)pUVar21].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar16[(long)pUVar21].m_backend.data + 0x10);
        local_938._16_8_ = *(undefined8 *)puVar1;
        local_938._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar16[(long)pUVar21].m_backend.data + 0x20);
        local_938._32_8_ = *(undefined8 *)puVar1;
        local_938._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar16[(long)pUVar21].m_backend.data + 0x30);
        local_938._48_8_ = *(undefined8 *)puVar1;
        local_678.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
        local_938._56_5_ = local_678.m_backend.data._M_elems._56_5_;
        local_938._61_3_ = local_678.m_backend.data._M_elems[0xf]._1_3_;
        local_938._64_4_ = pnVar16[(long)pUVar21].m_backend.exp;
        local_938[0x44] = pnVar16[(long)pUVar21].m_backend.neg;
        local_678.m_backend.fpclass = pnVar16[(long)pUVar21].m_backend.fpclass;
        local_678.m_backend.prec_elem = pnVar16[(long)pUVar21].m_backend.prec_elem;
        local_8f0._4_4_ = local_678.m_backend.prec_elem;
        local_8f0._0_4_ = local_678.m_backend.fpclass;
        pnVar16 = (local_8d8->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_988._0_8_ = *(undefined8 *)&pnVar16[(long)pUVar21].m_backend.data;
        local_988._8_8_ = *(undefined8 *)((long)&pnVar16[(long)pUVar21].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar16[(long)pUVar21].m_backend.data + 0x10);
        local_988._16_8_ = *(undefined8 *)puVar1;
        local_988._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar16[(long)pUVar21].m_backend.data + 0x20);
        local_988._32_8_ = *(undefined8 *)puVar1;
        local_988._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar16[(long)pUVar21].m_backend.data + 0x30);
        local_988._48_8_ = *(undefined8 *)puVar1;
        uVar4 = *(undefined8 *)(puVar1 + 2);
        local_988._56_5_ = (undefined5)uVar4;
        local_988._61_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_988._64_4_ = pnVar16[(long)pUVar21].m_backend.exp;
        local_988[0x44] = pnVar16[(long)pUVar21].m_backend.neg;
        local_940 = *(double *)&pnVar16[(long)pUVar21].m_backend.fpclass;
        local_8b8._0_8_ = *(undefined8 *)&pnVar2[(long)pUVar21].m_backend;
        local_8b8._8_8_ = *(undefined8 *)((long)&pnVar2[(long)pUVar21].m_backend + 8);
        local_8b8._16_8_ = *(undefined8 *)((long)(pnVar2 + (long)pUVar21) + 0x10);
        local_8b8._24_8_ = *(undefined8 *)((long)(pnVar2 + (long)pUVar21) + 0x18);
        local_8b8._32_8_ = *(undefined8 *)((long)(pnVar2 + (long)pUVar21) + 0x20);
        local_8b8._40_8_ = *(undefined8 *)((long)(pnVar2 + (long)pUVar21) + 0x28);
        local_8b8._48_8_ = *(undefined8 *)((long)(pnVar2 + (long)pUVar21) + 0x30);
        uVar4 = *(undefined8 *)((long)(pnVar2 + (long)pUVar21) + 0x38);
        local_8b8._56_5_ = (undefined5)uVar4;
        local_8b8._61_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_8b8._64_4_ = *(undefined4 *)((long)(pnVar2 + (long)pUVar21) + 0x40);
        local_8b8[0x44] = *(bool *)((long)(pnVar2 + (long)pUVar21) + 0x44);
        local_870 = *(double *)((long)(pnVar2 + (long)pUVar21) + 0x48);
        local_678.m_backend.data._M_elems._0_8_ = local_938._0_8_;
        local_678.m_backend.data._M_elems._8_8_ = local_938._8_8_;
        local_678.m_backend.data._M_elems._16_8_ = local_938._16_8_;
        local_678.m_backend.data._M_elems._24_8_ = local_938._24_8_;
        local_678.m_backend.data._M_elems._32_8_ = local_938._32_8_;
        local_678.m_backend.data._M_elems._40_8_ = local_938._40_8_;
        local_678.m_backend.data._M_elems._48_8_ = local_938._48_8_;
        local_678.m_backend.exp = local_938._64_4_;
        local_678.m_backend.neg = local_938[0x44];
        ::soplex::infinity::__tls_init();
        local_858 = &pnVar2[(long)pUVar21].m_backend;
        local_40 = 0x1000000000;
        local_88 = 0;
        uStack_80 = 0;
        local_78 = 0;
        uStack_70 = 0;
        local_68 = 0;
        uStack_60 = 0;
        local_58 = 0;
        uStack_50 = 0;
        uStack_4b = 0;
        uStack_48 = 0;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_88,local_8c8);
        local_178.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_178.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_178.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_178.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_178.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_178.m_backend.data._M_elems._40_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 10);
        local_178.m_backend.data._M_elems._48_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
        local_178.m_backend.data._M_elems._56_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
        local_178.m_backend.exp = (eps->m_backend).exp;
        local_178.m_backend.neg = (eps->m_backend).neg;
        local_178.m_backend.fpclass = (eps->m_backend).fpclass;
        local_178.m_backend.prec_elem = (eps->m_backend).prec_elem;
        bVar13 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (&local_678,
                            (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_88,&local_178);
        if (bVar13) {
          local_1c8._61_3_ = local_988._61_3_;
          local_1c8._56_5_ = local_988._56_5_;
          local_1c8._48_8_ = local_988._48_8_;
          local_1c8._32_8_ = local_988._32_8_;
          local_1c8._40_8_ = local_988._40_8_;
          local_1c8._16_8_ = local_988._16_8_;
          local_1c8._24_8_ = local_988._24_8_;
          local_1c8._0_8_ = local_988._0_8_;
          local_1c8._8_8_ = local_988._8_8_;
          local_1c8._64_4_ = local_988._64_4_;
          local_1c8[0x44] = local_988[0x44];
          local_1c8._72_8_ = local_940;
          local_218.m_backend.data._M_elems[0xf]._1_3_ = local_938._61_3_;
          local_218.m_backend.data._M_elems._56_5_ = local_938._56_5_;
          local_218.m_backend.data._M_elems[0] = local_938._0_4_;
          local_218.m_backend.data._M_elems[1] = local_938._4_4_;
          local_218.m_backend.data._M_elems[2] = local_938._8_4_;
          local_218.m_backend.data._M_elems[3] = local_938._12_4_;
          local_218.m_backend.data._M_elems[4] = local_938._16_4_;
          local_218.m_backend.data._M_elems[5] = local_938._20_4_;
          local_218.m_backend.data._M_elems[6] = local_938._24_4_;
          local_218.m_backend.data._M_elems[7] = local_938._28_4_;
          local_218.m_backend.data._M_elems[8] = local_938._32_4_;
          local_218.m_backend.data._M_elems[9] = local_938._36_4_;
          local_218.m_backend.data._M_elems[10] = local_938._40_4_;
          local_218.m_backend.data._M_elems[0xb] = local_938._44_4_;
          local_218.m_backend.data._M_elems[0xc] = local_938._48_4_;
          local_218.m_backend.data._M_elems[0xd] = local_938._52_4_;
          local_218.m_backend.exp = local_938._64_4_;
          local_218.m_backend.neg = local_938[0x44];
          local_218.m_backend.fpclass = (fpclass_type)local_8f0;
          local_218.m_backend.prec_elem = local_8f0._4_4_;
          local_268.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
          local_268.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 2);
          local_268.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 4);
          local_268.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 6);
          local_268.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 8);
          local_268.m_backend.data._M_elems._40_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 10);
          local_268.m_backend.data._M_elems._48_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
          local_268.m_backend.data._M_elems._56_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
          local_268.m_backend.exp = (eps->m_backend).exp;
          local_268.m_backend.neg = (eps->m_backend).neg;
          local_268.m_backend.fpclass = (eps->m_backend).fpclass;
          local_268.m_backend.prec_elem = (eps->m_backend).prec_elem;
          bVar13 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)local_1c8,&local_218,&local_268);
          if (bVar13) {
            local_a10 = 3.39519326554444e-313;
            local_a58._0_4_ = 0;
            local_a58._4_4_ = 0;
            local_a58._8_4_ = 0;
            local_a58._12_4_ = 0;
            local_a58._16_4_ = 0;
            local_a58._20_4_ = 0;
            local_a58._24_4_ = 0;
            local_a58._28_4_ = 0;
            local_a58._32_4_ = 0;
            local_a58._36_4_ = 0;
            local_a58._40_4_ = 0;
            local_a58._44_4_ = 0;
            local_a58._48_4_ = 0;
            local_a58._52_4_ = 0;
            local_a58._56_5_ = 0;
            local_a58._61_3_ = 0;
            local_a58._64_4_ = 0;
            local_a58[0x44] = false;
            pcVar18 = (cpp_dec_float<100U,_int,_void> *)local_8b8;
            if ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_a58 != eps) {
              local_a58._48_8_ = local_8b8._48_8_;
              local_a58._56_5_ = local_8b8._56_5_;
              local_a58._61_3_ = local_8b8._61_3_;
              local_a58._32_8_ = local_8b8._32_8_;
              local_a58._40_8_ = local_8b8._40_8_;
              local_a58._16_8_ = local_8b8._16_8_;
              local_a58._24_8_ = local_8b8._24_8_;
              local_a58._0_8_ = local_8b8._0_8_;
              local_a58._8_8_ = local_8b8._8_8_;
              local_a58._64_4_ = local_8b8._64_4_;
              local_a58[0x44] = local_8b8[0x44];
              local_a10 = local_870;
              pcVar18 = &eps->m_backend;
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      ((cpp_dec_float<100U,_int,_void> *)local_a58,pcVar18);
            if ((((fpclass_type)local_8f0 != cpp_dec_float_NaN) &&
                ((fpclass_type)local_a10 != cpp_dec_float_NaN)) &&
               ((iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                    ((cpp_dec_float<100U,_int,_void> *)local_938,
                                     (cpp_dec_float<100U,_int,_void> *)local_a58), iVar14 < 1 &&
                (stat[(long)pUVar21] * local_9a0->theRep < 0)))) {
              local_a00 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             extract_double(&local_7e8);
              local_998 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                          extract_double(&local_838);
              RVar3 = Random::next_random((Random *)local_868._0_8_);
              local_9f8.fpclass = cpp_dec_float_finite;
              local_9f8.prec_elem = 0x10;
              local_9f8.data._M_elems[0] = 0;
              local_9f8.data._M_elems[1] = 0;
              local_9f8.data._M_elems[2] = 0;
              local_9f8.data._M_elems[3] = 0;
              local_9f8.data._M_elems[4] = 0;
              local_9f8.data._M_elems[5] = 0;
              local_9f8.data._M_elems[6] = 0;
              local_9f8.data._M_elems[7] = 0;
              local_9f8.data._M_elems[8] = 0;
              local_9f8.data._M_elems[9] = 0;
              local_9f8.data._M_elems[10] = 0;
              local_9f8.data._M_elems[0xb] = 0;
              local_9f8.data._M_elems[0xc] = 0;
              local_9f8.data._M_elems[0xd] = 0;
              local_9f8.data._M_elems._56_5_ = 0;
              local_9f8.data._M_elems[0xf]._1_3_ = 0;
              local_9f8.exp = 0;
              local_9f8.neg = false;
              local_a10._0_4_ = cpp_dec_float_finite;
              local_a10._4_4_ = 0x10;
              local_a58._0_4_ = 0;
              local_a58._4_4_ = 0;
              local_a58._8_4_ = 0;
              local_a58._12_4_ = 0;
              local_a58._16_4_ = 0;
              local_a58._20_4_ = 0;
              local_a58._24_4_ = 0;
              local_a58._28_4_ = 0;
              local_a58._32_4_ = 0;
              local_a58._36_4_ = 0;
              local_a58._40_4_ = 0;
              local_a58._44_4_ = 0;
              local_a58._48_4_ = 0;
              local_a58._52_4_ = 0;
              local_a58._56_5_ = 0;
              local_a58._61_3_ = 0;
              local_a58._64_4_ = 0;
              local_a58[0x44] = false;
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)local_a58,
                         RVar3 * local_998 + (1.0 - RVar3) * (double)local_a00);
              if (&local_9f8 != local_858) {
                local_9f8.data._M_elems._0_8_ =
                     *(undefined8 *)
                      (((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data)._M_elems;
                local_9f8.data._M_elems._8_8_ =
                     *(undefined8 *)
                      ((long)(((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data)._M_elems +
                      8);
                local_9f8.data._M_elems._16_8_ =
                     *(undefined8 *)
                      ((long)(((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data)._M_elems +
                      0x10);
                local_9f8.data._M_elems._24_8_ =
                     *(undefined8 *)
                      ((long)(((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data)._M_elems +
                      0x18);
                local_9f8.data._M_elems._32_8_ =
                     *(undefined8 *)
                      ((long)(((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data)._M_elems +
                      0x20);
                local_9f8.data._M_elems._40_8_ =
                     *(undefined8 *)
                      ((long)(((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data)._M_elems +
                      0x28);
                local_9f8.data._M_elems._48_8_ =
                     *(undefined8 *)
                      ((long)(((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data)._M_elems +
                      0x30);
                uVar4 = *(undefined8 *)
                         ((long)(((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data).
                                _M_elems + 0x38);
                local_9f8.data._M_elems._56_5_ = SUB85(uVar4,0);
                local_9f8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_9f8.exp = local_858->exp;
                local_9f8.neg = local_858->neg;
                local_9f8.fpclass = local_858->fpclass;
                local_9f8.prec_elem = local_858->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (&local_9f8,(cpp_dec_float<100U,_int,_void> *)local_a58);
              pnVar16 = (local_8d0->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar1 = (uint *)((long)&pnVar16[(long)pUVar21].m_backend.data + 0x30);
              *(undefined8 *)puVar1 = local_9f8.data._M_elems._48_8_;
              *(ulong *)(puVar1 + 2) =
                   CONCAT35(local_9f8.data._M_elems[0xf]._1_3_,local_9f8.data._M_elems._56_5_);
              puVar1 = (uint *)((long)&pnVar16[(long)pUVar21].m_backend.data + 0x20);
              *(undefined8 *)puVar1 = local_9f8.data._M_elems._32_8_;
              *(undefined8 *)(puVar1 + 2) = local_9f8.data._M_elems._40_8_;
              puVar1 = (uint *)((long)&pnVar16[(long)pUVar21].m_backend.data + 0x10);
              *(undefined8 *)puVar1 = local_9f8.data._M_elems._16_8_;
              *(undefined8 *)(puVar1 + 2) = local_9f8.data._M_elems._24_8_;
              *(undefined8 *)&pnVar16[(long)pUVar21].m_backend.data = local_9f8.data._M_elems._0_8_;
              *(undefined8 *)((long)&pnVar16[(long)pUVar21].m_backend.data + 8) =
                   local_9f8.data._M_elems._8_8_;
              pnVar16[(long)pUVar21].m_backend.exp = local_9f8.exp;
              pnVar16[(long)pUVar21].m_backend.neg = local_9f8.neg;
              pnVar16[(long)pUVar21].m_backend.fpclass = local_9f8.fpclass;
              pnVar16[(long)pUVar21].m_backend.prec_elem = local_9f8.prec_elem;
              pnVar16 = (local_8d0->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)pUVar21;
              local_a10 = 3.39519326554444e-313;
              local_a58._0_4_ = 0;
              local_a58._4_4_ = 0;
              local_a58._8_4_ = 0;
              local_a58._12_4_ = 0;
              local_a58._16_4_ = 0;
              local_a58._20_4_ = 0;
              local_a58._24_4_ = 0;
              local_a58._28_4_ = 0;
              local_a58._32_4_ = 0;
              local_a58._36_4_ = 0;
              local_a58._40_4_ = 0;
              local_a58._44_4_ = 0;
              local_a58._48_4_ = 0;
              local_a58._52_4_ = 0;
              local_a58._56_5_ = 0;
              local_a58._61_3_ = 0;
              local_a58._64_4_ = 0;
              local_a58[0x44] = false;
              if ((pointer)local_a58 != pnVar16) {
                local_a58._0_8_ = *(undefined8 *)&(pnVar16->m_backend).data;
                local_a58._8_8_ = *(undefined8 *)((long)&(pnVar16->m_backend).data + 8);
                local_a58._16_8_ = *(undefined8 *)((long)&(pnVar16->m_backend).data + 0x10);
                local_a58._24_8_ = *(undefined8 *)((long)&(pnVar16->m_backend).data + 0x18);
                local_a58._32_8_ = *(undefined8 *)((long)&(pnVar16->m_backend).data + 0x20);
                local_a58._40_8_ = *(undefined8 *)((long)&(pnVar16->m_backend).data + 0x28);
                local_a58._48_8_ = *(undefined8 *)((long)&(pnVar16->m_backend).data + 0x30);
                uVar4 = *(undefined8 *)((long)&(pnVar16->m_backend).data + 0x38);
                local_a58._56_5_ = (undefined5)uVar4;
                local_a58._61_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_a58._64_4_ = (pnVar16->m_backend).exp;
                local_a58[0x44] = (pnVar16->m_backend).neg;
                local_a10 = *(double *)&(pnVar16->m_backend).fpclass;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        ((cpp_dec_float<100U,_int,_void> *)local_a58,
                         (cpp_dec_float<100U,_int,_void> *)local_938);
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_8e8,(cpp_dec_float<100U,_int,_void> *)local_a58);
            }
          }
        }
        bVar13 = local_988[0x44];
        uVar12 = local_988._64_4_;
        uStack_720 = CONCAT35(local_988._61_3_,local_988._56_5_);
        local_728[0] = local_988._48_4_;
        local_728[1] = local_988._52_4_;
        local_738[0] = local_988._32_4_;
        local_738[1] = local_988._36_4_;
        auStack_730[0] = local_988._40_4_;
        auStack_730[1] = local_988._44_4_;
        local_748[0] = local_988._16_4_;
        local_748[1] = local_988._20_4_;
        auStack_740[0] = local_988._24_4_;
        auStack_740[1] = local_988._28_4_;
        local_758[0] = local_988._0_4_;
        local_758[1] = local_988._4_4_;
        auStack_750[0] = local_988._8_4_;
        auStack_750[1] = local_988._12_4_;
        local_998 = local_940;
        uStack_990 = 0;
        local_a00 = pUVar21;
        ::soplex::infinity::__tls_init();
        local_d8.fpclass = cpp_dec_float_finite;
        local_d8.prec_elem = 0x10;
        local_d8.data._M_elems[0] = 0;
        local_d8.data._M_elems[1] = 0;
        local_d8.data._M_elems[2] = 0;
        local_d8.data._M_elems[3] = 0;
        local_d8.data._M_elems[4] = 0;
        local_d8.data._M_elems[5] = 0;
        local_d8.data._M_elems[6] = 0;
        local_d8.data._M_elems[7] = 0;
        local_d8.data._M_elems[8] = 0;
        local_d8.data._M_elems[9] = 0;
        local_d8.data._M_elems[10] = 0;
        local_d8.data._M_elems[0xb] = 0;
        local_d8.data._M_elems[0xc] = 0;
        local_d8.data._M_elems[0xd] = 0;
        local_d8.data._M_elems._56_5_ = 0;
        local_d8.data._M_elems[0xf]._1_3_ = 0;
        local_d8.exp = 0;
        local_d8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_d8,(double)local_848._0_8_);
        local_6c8.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_6c8.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_6c8.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_6c8.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_6c8.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_6c8.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
        local_6c8.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
        local_6c8.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
        local_6c8.exp = (eps->m_backend).exp;
        local_6c8.neg = (eps->m_backend).neg;
        local_6c8.fpclass = (eps->m_backend).fpclass;
        local_6c8.prec_elem = (eps->m_backend).prec_elem;
        local_a58._48_4_ = local_728[0];
        local_a58._52_4_ = local_728[1];
        local_a58._56_5_ = (undefined5)uStack_720;
        local_a58._61_3_ = (undefined3)((ulong)uStack_720 >> 0x28);
        local_a58._32_4_ = local_738[0];
        local_a58._36_4_ = local_738[1];
        local_a58._40_4_ = auStack_730[0];
        local_a58._44_4_ = auStack_730[1];
        local_a58._16_4_ = local_748[0];
        local_a58._20_4_ = local_748[1];
        local_a58._24_4_ = auStack_740[0];
        local_a58._28_4_ = auStack_740[1];
        local_a58._0_4_ = local_758[0];
        local_a58._4_4_ = local_758[1];
        local_a58._8_4_ = auStack_750[0];
        local_a58._12_4_ = auStack_750[1];
        local_a58._64_4_ = uVar12;
        local_a58[0x44] = bVar13;
        local_a10 = local_998;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  ((cpp_dec_float<100U,_int,_void> *)local_a58,&local_d8);
        pUVar22 = local_a00;
        if ((((fpclass_type)local_a10 != cpp_dec_float_NaN) &&
            (local_6c8.fpclass != cpp_dec_float_NaN)) &&
           (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)local_a58,&local_6c8),
           pUVar22 = local_a00, 0 < iVar14)) {
          local_2b8._61_3_ = local_988._61_3_;
          local_2b8._56_5_ = local_988._56_5_;
          local_2b8._48_8_ = local_988._48_8_;
          local_2b8._32_8_ = local_988._32_8_;
          local_2b8._40_8_ = local_988._40_8_;
          local_2b8._16_8_ = local_988._16_8_;
          local_2b8._24_8_ = local_988._24_8_;
          local_2b8._0_8_ = local_988._0_8_;
          local_2b8._8_8_ = local_988._8_8_;
          local_2b8._64_4_ = local_988._64_4_;
          local_2b8[0x44] = local_988[0x44];
          local_2b8._72_8_ = local_940;
          local_308.m_backend.data._M_elems[0xf]._1_3_ = local_938._61_3_;
          local_308.m_backend.data._M_elems._56_5_ = local_938._56_5_;
          local_308.m_backend.data._M_elems[0] = local_938._0_4_;
          local_308.m_backend.data._M_elems[1] = local_938._4_4_;
          local_308.m_backend.data._M_elems[2] = local_938._8_4_;
          local_308.m_backend.data._M_elems[3] = local_938._12_4_;
          local_308.m_backend.data._M_elems[4] = local_938._16_4_;
          local_308.m_backend.data._M_elems[5] = local_938._20_4_;
          local_308.m_backend.data._M_elems[6] = local_938._24_4_;
          local_308.m_backend.data._M_elems[7] = local_938._28_4_;
          local_308.m_backend.data._M_elems[8] = local_938._32_4_;
          local_308.m_backend.data._M_elems[9] = local_938._36_4_;
          local_308.m_backend.data._M_elems[10] = local_938._40_4_;
          local_308.m_backend.data._M_elems[0xb] = local_938._44_4_;
          local_308.m_backend.data._M_elems[0xc] = local_938._48_4_;
          local_308.m_backend.data._M_elems[0xd] = local_938._52_4_;
          local_308.m_backend.exp = local_938._64_4_;
          local_308.m_backend.neg = local_938[0x44];
          local_308.m_backend.fpclass = (fpclass_type)local_8f0;
          local_308.m_backend.prec_elem = local_8f0._4_4_;
          local_358.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
          local_358.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 2);
          local_358.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 4);
          local_358.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 6);
          local_358.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 8);
          local_358.m_backend.data._M_elems._40_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 10);
          local_358.m_backend.data._M_elems._48_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
          local_358.m_backend.data._M_elems._56_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
          local_358.m_backend.exp = (eps->m_backend).exp;
          local_358.m_backend.neg = (eps->m_backend).neg;
          local_358.m_backend.fpclass = (eps->m_backend).fpclass;
          local_358.m_backend.prec_elem = (eps->m_backend).prec_elem;
          bVar13 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)local_2b8,&local_308,&local_358);
          if (bVar13) {
            local_a10 = 3.39519326554444e-313;
            local_a58._0_4_ = 0;
            local_a58._4_4_ = 0;
            local_a58._8_4_ = 0;
            local_a58._12_4_ = 0;
            local_a58._16_4_ = 0;
            local_a58._20_4_ = 0;
            local_a58._24_4_ = 0;
            local_a58._28_4_ = 0;
            local_a58._32_4_ = 0;
            local_a58._36_4_ = 0;
            local_a58._40_4_ = 0;
            local_a58._44_4_ = 0;
            local_a58._48_4_ = 0;
            local_a58._52_4_ = 0;
            local_a58._56_5_ = 0;
            local_a58._61_3_ = 0;
            local_a58._64_4_ = 0;
            local_a58[0x44] = false;
            if ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_a58 == eps) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        ((cpp_dec_float<100U,_int,_void> *)local_a58,
                         (cpp_dec_float<100U,_int,_void> *)local_8b8);
              fVar15 = cpp_dec_float_finite;
              if (local_a58._0_4_ != 0 || (fpclass_type)local_a10 != cpp_dec_float_finite) {
                local_a58[0x44] = local_a58[0x44] ^ 1;
                fVar15 = (fpclass_type)local_a10;
              }
            }
            else {
              local_a58._48_8_ = local_8b8._48_8_;
              local_a58._56_5_ = local_8b8._56_5_;
              local_a58._61_3_ = local_8b8._61_3_;
              local_a58._32_8_ = local_8b8._32_8_;
              local_a58._40_8_ = local_8b8._40_8_;
              local_a58._16_8_ = local_8b8._16_8_;
              local_a58._24_8_ = local_8b8._24_8_;
              local_a58._0_8_ = local_8b8._0_8_;
              local_a58._8_8_ = local_8b8._8_8_;
              local_a58._64_4_ = local_8b8._64_4_;
              local_a58[0x44] = local_8b8[0x44];
              local_a10 = local_870;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        ((cpp_dec_float<100U,_int,_void> *)local_a58,&eps->m_backend);
              fVar15 = (fpclass_type)local_a10;
            }
            if (((((fpclass_type)local_940 != cpp_dec_float_NaN) && (fVar15 != cpp_dec_float_NaN))
                && (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)local_988,
                                     (cpp_dec_float<100U,_int,_void> *)local_a58), -1 < iVar14)) &&
               (stat[(long)pUVar22] * local_9a0->theRep < 0)) {
              local_998 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                          extract_double(&local_7e8);
              local_8e0 = (Random *)
                          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                          extract_double(&local_838);
              RVar3 = Random::next_random((Random *)local_868._0_8_);
              local_9f8.fpclass = cpp_dec_float_finite;
              local_9f8.prec_elem = 0x10;
              local_9f8.data._M_elems[0] = 0;
              local_9f8.data._M_elems[1] = 0;
              local_9f8.data._M_elems[2] = 0;
              local_9f8.data._M_elems[3] = 0;
              local_9f8.data._M_elems[4] = 0;
              local_9f8.data._M_elems[5] = 0;
              local_9f8.data._M_elems[6] = 0;
              local_9f8.data._M_elems[7] = 0;
              local_9f8.data._M_elems[8] = 0;
              local_9f8.data._M_elems[9] = 0;
              local_9f8.data._M_elems[10] = 0;
              local_9f8.data._M_elems[0xb] = 0;
              local_9f8.data._M_elems[0xc] = 0;
              local_9f8.data._M_elems[0xd] = 0;
              local_9f8.data._M_elems._56_5_ = 0;
              local_9f8.data._M_elems[0xf]._1_3_ = 0;
              local_9f8.exp = 0;
              local_9f8.neg = false;
              local_a10._0_4_ = cpp_dec_float_finite;
              local_a10._4_4_ = 0x10;
              local_a58._0_4_ = 0;
              local_a58._4_4_ = 0;
              local_a58._8_4_ = 0;
              local_a58._12_4_ = 0;
              local_a58._16_4_ = 0;
              local_a58._20_4_ = 0;
              local_a58._24_4_ = 0;
              local_a58._28_4_ = 0;
              local_a58._32_4_ = 0;
              local_a58._36_4_ = 0;
              local_a58._40_4_ = 0;
              local_a58._44_4_ = 0;
              local_a58._48_4_ = 0;
              local_a58._52_4_ = 0;
              local_a58._56_5_ = 0;
              local_a58._61_3_ = 0;
              local_a58._64_4_ = 0;
              local_a58[0x44] = false;
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)local_a58,
                         RVar3 * (double)local_8e0 + (1.0 - RVar3) * local_998);
              if (&local_9f8 != local_858) {
                local_9f8.data._M_elems._0_8_ =
                     *(undefined8 *)
                      (((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data)._M_elems;
                local_9f8.data._M_elems._8_8_ =
                     *(undefined8 *)
                      ((long)(((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data)._M_elems +
                      8);
                local_9f8.data._M_elems._16_8_ =
                     *(undefined8 *)
                      ((long)(((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data)._M_elems +
                      0x10);
                local_9f8.data._M_elems._24_8_ =
                     *(undefined8 *)
                      ((long)(((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data)._M_elems +
                      0x18);
                local_9f8.data._M_elems._32_8_ =
                     *(undefined8 *)
                      ((long)(((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data)._M_elems +
                      0x20);
                local_9f8.data._M_elems._40_8_ =
                     *(undefined8 *)
                      ((long)(((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data)._M_elems +
                      0x28);
                local_9f8.data._M_elems._48_8_ =
                     *(undefined8 *)
                      ((long)(((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data)._M_elems +
                      0x30);
                uVar4 = *(undefined8 *)
                         ((long)(((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data).
                                _M_elems + 0x38);
                local_9f8.data._M_elems._56_5_ = SUB85(uVar4,0);
                local_9f8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_9f8.exp = local_858->exp;
                local_9f8.neg = local_858->neg;
                local_9f8.fpclass = local_858->fpclass;
                local_9f8.prec_elem = local_858->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_9f8,(cpp_dec_float<100U,_int,_void> *)local_a58);
              pnVar16 = (local_8d8->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar1 = (uint *)((long)&pnVar16[(long)pUVar21].m_backend.data + 0x30);
              *(undefined8 *)puVar1 = local_9f8.data._M_elems._48_8_;
              *(ulong *)(puVar1 + 2) =
                   CONCAT35(local_9f8.data._M_elems[0xf]._1_3_,local_9f8.data._M_elems._56_5_);
              puVar1 = (uint *)((long)&pnVar16[(long)pUVar21].m_backend.data + 0x20);
              *(undefined8 *)puVar1 = local_9f8.data._M_elems._32_8_;
              *(undefined8 *)(puVar1 + 2) = local_9f8.data._M_elems._40_8_;
              puVar1 = (uint *)((long)&pnVar16[(long)pUVar21].m_backend.data + 0x10);
              *(undefined8 *)puVar1 = local_9f8.data._M_elems._16_8_;
              *(undefined8 *)(puVar1 + 2) = local_9f8.data._M_elems._24_8_;
              *(undefined8 *)&pnVar16[(long)pUVar21].m_backend.data = local_9f8.data._M_elems._0_8_;
              *(undefined8 *)((long)&pnVar16[(long)pUVar21].m_backend.data + 8) =
                   local_9f8.data._M_elems._8_8_;
              pnVar16[(long)pUVar21].m_backend.exp = local_9f8.exp;
              pnVar16[(long)pUVar21].m_backend.neg = local_9f8.neg;
              pnVar16[(long)pUVar21].m_backend.fpclass = local_9f8.fpclass;
              pnVar16[(long)pUVar21].m_backend.prec_elem = local_9f8.prec_elem;
              pnVar16 = (local_8d8->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)pUVar21;
              local_a10 = 3.39519326554444e-313;
              local_a58._0_4_ = 0;
              local_a58._4_4_ = 0;
              local_a58._8_4_ = 0;
              local_a58._12_4_ = 0;
              local_a58._16_4_ = 0;
              local_a58._20_4_ = 0;
              local_a58._24_4_ = 0;
              local_a58._28_4_ = 0;
              local_a58._32_4_ = 0;
              local_a58._36_4_ = 0;
              local_a58._40_4_ = 0;
              local_a58._44_4_ = 0;
              local_a58._48_4_ = 0;
              local_a58._52_4_ = 0;
              local_a58._56_5_ = 0;
              local_a58._61_3_ = 0;
              local_a58._64_4_ = 0;
              local_a58[0x44] = false;
              if ((pointer)local_a58 != pnVar16) {
                local_a58._0_8_ = *(undefined8 *)&(pnVar16->m_backend).data;
                local_a58._8_8_ = *(undefined8 *)((long)&(pnVar16->m_backend).data + 8);
                local_a58._16_8_ = *(undefined8 *)((long)&(pnVar16->m_backend).data + 0x10);
                local_a58._24_8_ = *(undefined8 *)((long)&(pnVar16->m_backend).data + 0x18);
                local_a58._32_8_ = *(undefined8 *)((long)&(pnVar16->m_backend).data + 0x20);
                local_a58._40_8_ = *(undefined8 *)((long)&(pnVar16->m_backend).data + 0x28);
                local_a58._48_8_ = *(undefined8 *)((long)&(pnVar16->m_backend).data + 0x30);
                uVar4 = *(undefined8 *)((long)&(pnVar16->m_backend).data + 0x38);
                local_a58._56_5_ = (undefined5)uVar4;
                local_a58._61_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_a58._64_4_ = (pnVar16->m_backend).exp;
                local_a58[0x44] = (pnVar16->m_backend).neg;
                local_a10 = *(double *)&(pnVar16->m_backend).fpclass;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        ((cpp_dec_float<100U,_int,_void> *)local_a58,
                         (cpp_dec_float<100U,_int,_void> *)local_988);
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (local_8e8,(cpp_dec_float<100U,_int,_void> *)local_a58);
            }
          }
        }
        uVar20 = (int)pUVar22 - incr;
      } while (-1 < (int)uVar20);
    }
  }
  else {
    uVar20 = ~start + (local_a00->thedelta).super_IdxSet.num;
    if (-1 < (int)uVar20) {
      pnVar16 = (local_a00->thedelta).
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_858 = *(cpp_dec_float<100U,_int,_void> **)(in_FS_OFFSET + -8);
      local_8e0 = &local_9a0->random;
      uStack_850 = 0;
      local_868._8_4_ = DAT_005f4010._8_4_;
      local_868._0_8_ = (ulong)DAT_005f4010 ^ (ulong)local_858;
      local_868._12_4_ = DAT_005f4010._12_4_;
      do {
        lVar17 = (long)(local_a00->thedelta).super_IdxSet.idx[uVar20];
        local_8b8._0_8_ = *(undefined8 *)&pnVar16[lVar17].m_backend.data;
        local_8b8._8_8_ = *(undefined8 *)((long)&pnVar16[lVar17].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar16[lVar17].m_backend.data + 0x10);
        local_8b8._16_8_ = *(undefined8 *)puVar1;
        local_8b8._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar16[lVar17].m_backend.data + 0x20);
        local_8b8._32_8_ = *(undefined8 *)puVar1;
        local_8b8._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar16[lVar17].m_backend.data + 0x30);
        local_8b8._48_8_ = *(undefined8 *)puVar1;
        uVar4 = *(undefined8 *)(puVar1 + 2);
        local_8b8._56_5_ = (undefined5)uVar4;
        local_8b8._61_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_8b8._64_4_ = pnVar16[lVar17].m_backend.exp;
        local_8b8[0x44] = pnVar16[lVar17].m_backend.neg;
        local_870._0_4_ = pnVar16[lVar17].m_backend.fpclass;
        local_870._4_4_ = pnVar16[lVar17].m_backend.prec_elem;
        pnVar19 = (local_8d0->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_938._0_8_ = *(undefined8 *)&pnVar19[lVar17].m_backend.data;
        local_938._8_8_ = *(undefined8 *)((long)&pnVar19[lVar17].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar19[lVar17].m_backend.data + 0x10);
        local_938._16_8_ = *(undefined8 *)puVar1;
        local_938._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar19[lVar17].m_backend.data + 0x20);
        local_938._32_8_ = *(undefined8 *)puVar1;
        local_938._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar19[lVar17].m_backend.data + 0x30);
        local_938._48_8_ = *(undefined8 *)puVar1;
        uVar4 = *(undefined8 *)(puVar1 + 2);
        local_938._56_5_ = (undefined5)uVar4;
        local_938._61_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_938._64_4_ = pnVar19[lVar17].m_backend.exp;
        local_938[0x44] = pnVar19[lVar17].m_backend.neg;
        local_8f0 = *(double *)&pnVar19[lVar17].m_backend.fpclass;
        pnVar19 = (local_8d8->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_988._0_8_ = *(undefined8 *)&pnVar19[lVar17].m_backend.data;
        local_988._8_8_ = *(undefined8 *)((long)&pnVar19[lVar17].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar19[lVar17].m_backend.data + 0x10);
        local_988._16_8_ = *(undefined8 *)puVar1;
        local_988._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar19[lVar17].m_backend.data + 0x20);
        local_988._32_8_ = *(undefined8 *)puVar1;
        local_988._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar19[lVar17].m_backend.data + 0x30);
        local_988._48_8_ = *(undefined8 *)puVar1;
        uVar4 = *(undefined8 *)(puVar1 + 2);
        local_988._56_5_ = (undefined5)uVar4;
        local_988._61_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_988._64_4_ = pnVar19[lVar17].m_backend.exp;
        local_988[0x44] = pnVar19[lVar17].m_backend.neg;
        local_940 = *(double *)&pnVar19[lVar17].m_backend.fpclass;
        fVar15 = (eps->m_backend).fpclass;
        local_998 = (double)lVar17;
        if (fVar15 == cpp_dec_float_NaN || (fpclass_type)local_870 == cpp_dec_float_NaN) {
LAB_003d9180:
          local_a58._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
          local_a58._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
          local_a58._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
          local_a58._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
          local_a58._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
          local_a58._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
          local_a58._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
          uVar4 = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
          local_a58._56_5_ = (undefined5)uVar4;
          local_a58._61_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          local_a58._64_4_ = (eps->m_backend).exp;
          local_a58[0x44] = (eps->m_backend).neg;
          local_a10 = (double)CONCAT44((eps->m_backend).prec_elem,fVar15);
          if (local_a58._0_4_ != 0 || fVar15 != cpp_dec_float_finite) {
            local_a58[0x44] = local_a58[0x44] ^ 1;
          }
          if (((fVar15 != cpp_dec_float_NaN) && ((fpclass_type)local_870 != cpp_dec_float_NaN)) &&
             (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 ((cpp_dec_float<100U,_int,_void> *)local_8b8,
                                  (cpp_dec_float<100U,_int,_void> *)local_a58),
             uVar12 = local_988._64_4_, iVar14 < 0)) {
            uStack_760 = CONCAT35(local_988._61_3_,local_988._56_5_);
            local_768[0] = local_988._48_4_;
            local_768[1] = local_988._52_4_;
            local_778[0] = local_988._32_4_;
            local_778[1] = local_988._36_4_;
            auStack_770[0] = local_988._40_4_;
            auStack_770[1] = local_988._44_4_;
            local_788[0] = local_988._16_4_;
            local_788[1] = local_988._20_4_;
            auStack_780[0] = local_988._24_4_;
            auStack_780[1] = local_988._28_4_;
            local_798[0] = local_988._0_4_;
            local_798[1] = local_988._4_4_;
            auStack_790[0] = local_988._8_4_;
            auStack_790[1] = local_988._12_4_;
            local_8c8 = (double)CONCAT71(local_8c8._1_7_,local_988[0x44]);
            local_848._8_8_ = 0;
            local_848._0_8_ = local_940;
            ::soplex::infinity::__tls_init();
            local_538.fpclass = cpp_dec_float_finite;
            local_538.prec_elem = 0x10;
            local_538.data._M_elems[0] = 0;
            local_538.data._M_elems[1] = 0;
            local_538.data._M_elems[2] = 0;
            local_538.data._M_elems[3] = 0;
            local_538.data._M_elems[4] = 0;
            local_538.data._M_elems[5] = 0;
            local_538.data._M_elems[6] = 0;
            local_538.data._M_elems[7] = 0;
            local_538.data._M_elems[8] = 0;
            local_538.data._M_elems[9] = 0;
            local_538.data._M_elems[10] = 0;
            local_538.data._M_elems[0xb] = 0;
            local_538.data._M_elems[0xc] = 0;
            local_538.data._M_elems[0xd] = 0;
            local_538.data._M_elems._56_5_ = 0;
            local_538.data._M_elems[0xf]._1_3_ = 0;
            local_538.exp = 0;
            local_538.neg = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&local_538,(double)local_868._0_8_);
            local_718.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
            local_718.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
            local_718.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
            local_718.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
            local_718.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
            local_718.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
            local_718.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
            local_718.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
            local_718.exp = (eps->m_backend).exp;
            local_718.neg = (eps->m_backend).neg;
            local_718.fpclass = (eps->m_backend).fpclass;
            local_718.prec_elem = (eps->m_backend).prec_elem;
            local_a58._48_4_ = local_768[0];
            local_a58._52_4_ = local_768[1];
            local_a58._56_5_ = (undefined5)uStack_760;
            local_a58._61_3_ = (undefined3)((ulong)uStack_760 >> 0x28);
            local_a58._32_4_ = local_778[0];
            local_a58._36_4_ = local_778[1];
            local_a58._40_4_ = auStack_770[0];
            local_a58._44_4_ = auStack_770[1];
            local_a58._16_4_ = local_788[0];
            local_a58._20_4_ = local_788[1];
            local_a58._24_4_ = auStack_780[0];
            local_a58._28_4_ = auStack_780[1];
            local_a58._0_4_ = local_798[0];
            local_a58._4_4_ = local_798[1];
            local_a58._8_4_ = auStack_790[0];
            local_a58._12_4_ = auStack_790[1];
            local_a58._64_4_ = uVar12;
            local_a58[0x44] = local_8c8._0_1_;
            local_a10 = (double)local_848._0_8_;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      ((cpp_dec_float<100U,_int,_void> *)local_a58,&local_538);
            if ((((fpclass_type)local_a10 != cpp_dec_float_NaN) &&
                (local_718.fpclass != cpp_dec_float_NaN)) &&
               (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   ((cpp_dec_float<100U,_int,_void> *)local_a58,&local_718),
               0 < iVar14)) {
              local_588._61_3_ = local_988._61_3_;
              local_588._56_5_ = local_988._56_5_;
              local_588._48_8_ = local_988._48_8_;
              local_588._32_8_ = local_988._32_8_;
              local_588._40_8_ = local_988._40_8_;
              local_588._16_8_ = local_988._16_8_;
              local_588._24_8_ = local_988._24_8_;
              local_588._0_8_ = local_988._0_8_;
              local_588._8_8_ = local_988._8_8_;
              local_588._64_4_ = local_988._64_4_;
              local_588[0x44] = local_988[0x44];
              local_588._72_8_ = local_940;
              local_5d8._61_3_ = local_938._61_3_;
              local_5d8._56_5_ = local_938._56_5_;
              local_5d8._0_8_ = local_938._0_8_;
              local_5d8._8_8_ = local_938._8_8_;
              local_5d8._16_8_ = local_938._16_8_;
              local_5d8._24_8_ = local_938._24_8_;
              local_5d8._32_8_ = local_938._32_8_;
              local_5d8._40_8_ = local_938._40_8_;
              local_5d8._48_8_ = local_938._48_8_;
              local_5d8._64_4_ = local_938._64_4_;
              local_5d8[0x44] = local_938[0x44];
              local_5d8._72_8_ = local_8f0;
              local_628.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)(eps->m_backend).data._M_elems;
              local_628.m_backend.data._M_elems._8_8_ =
                   *(undefined8 *)((eps->m_backend).data._M_elems + 2);
              local_628.m_backend.data._M_elems._16_8_ =
                   *(undefined8 *)((eps->m_backend).data._M_elems + 4);
              local_628.m_backend.data._M_elems._24_8_ =
                   *(undefined8 *)((eps->m_backend).data._M_elems + 6);
              local_628.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)((eps->m_backend).data._M_elems + 8);
              local_628.m_backend.data._M_elems._40_8_ =
                   *(undefined8 *)((eps->m_backend).data._M_elems + 10);
              local_628.m_backend.data._M_elems._48_8_ =
                   *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
              local_628.m_backend.data._M_elems._56_8_ =
                   *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
              local_628.m_backend.exp = (eps->m_backend).exp;
              local_628.m_backend.neg = (eps->m_backend).neg;
              local_628.m_backend.fpclass = (eps->m_backend).fpclass;
              local_628.m_backend.prec_elem = (eps->m_backend).prec_elem;
              bVar13 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                 ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)local_588,
                                  (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)local_5d8,&local_628);
              if (bVar13) {
                local_a10 = 3.39519326554444e-313;
                local_a58._0_4_ = 0;
                local_a58._4_4_ = 0;
                local_a58._8_4_ = 0;
                local_a58._12_4_ = 0;
                local_a58._16_4_ = 0;
                local_a58._20_4_ = 0;
                local_a58._24_4_ = 0;
                local_a58._28_4_ = 0;
                local_a58._32_4_ = 0;
                local_a58._36_4_ = 0;
                local_a58._40_4_ = 0;
                local_a58._44_4_ = 0;
                local_a58._48_4_ = 0;
                local_a58._52_4_ = 0;
                local_a58._56_5_ = 0;
                local_a58._61_3_ = 0;
                local_a58._64_4_ = 0;
                local_a58[0x44] = false;
                pcVar18 = (cpp_dec_float<100U,_int,_void> *)local_988;
                if ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)local_a58 != eps) {
                  local_a58._48_8_ = local_988._48_8_;
                  local_a58._56_5_ = local_988._56_5_;
                  local_a58._61_3_ = local_988._61_3_;
                  local_a58._32_8_ = local_988._32_8_;
                  local_a58._40_8_ = local_988._40_8_;
                  local_a58._16_8_ = local_988._16_8_;
                  local_a58._24_8_ = local_988._24_8_;
                  local_a58._0_8_ = local_988._0_8_;
                  local_a58._8_8_ = local_988._8_8_;
                  local_a58._64_4_ = local_988._64_4_;
                  local_a58[0x44] = local_988[0x44];
                  local_a10 = local_940;
                  pcVar18 = &eps->m_backend;
                }
                this_00 = &pnVar2[(long)local_998].m_backend;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          ((cpp_dec_float<100U,_int,_void> *)local_a58,pcVar18);
                if (((this_00->fpclass != cpp_dec_float_NaN) &&
                    ((fpclass_type)local_a10 != cpp_dec_float_NaN)) &&
                   ((iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                              compare(this_00,(cpp_dec_float<100U,_int,_void> *)local_a58),
                    iVar14 < 1 && (stat[(long)local_998] * local_9a0->theRep < 0)))) {
                  local_998 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                              extract_double(&local_7e8);
                  local_8c8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                              extract_double(&local_838);
                  RVar3 = Random::next_random(local_8e0);
                  local_9f8.fpclass = cpp_dec_float_finite;
                  local_9f8.prec_elem = 0x10;
                  local_9f8.data._M_elems[0] = 0;
                  local_9f8.data._M_elems[1] = 0;
                  local_9f8.data._M_elems[2] = 0;
                  local_9f8.data._M_elems[3] = 0;
                  local_9f8.data._M_elems[4] = 0;
                  local_9f8.data._M_elems[5] = 0;
                  local_9f8.data._M_elems[6] = 0;
                  local_9f8.data._M_elems[7] = 0;
                  local_9f8.data._M_elems[8] = 0;
                  local_9f8.data._M_elems[9] = 0;
                  local_9f8.data._M_elems[10] = 0;
                  local_9f8.data._M_elems[0xb] = 0;
                  local_9f8.data._M_elems[0xc] = 0;
                  local_9f8.data._M_elems[0xd] = 0;
                  local_9f8.data._M_elems._56_5_ = 0;
                  local_9f8.data._M_elems[0xf]._1_3_ = 0;
                  local_9f8.exp = 0;
                  local_9f8.neg = false;
                  local_a10._0_4_ = cpp_dec_float_finite;
                  local_a10._4_4_ = 0x10;
                  local_a58._0_4_ = 0;
                  local_a58._4_4_ = 0;
                  local_a58._8_4_ = 0;
                  local_a58._12_4_ = 0;
                  local_a58._16_4_ = 0;
                  local_a58._20_4_ = 0;
                  local_a58._24_4_ = 0;
                  local_a58._28_4_ = 0;
                  local_a58._32_4_ = 0;
                  local_a58._36_4_ = 0;
                  local_a58._40_4_ = 0;
                  local_a58._44_4_ = 0;
                  local_a58._48_4_ = 0;
                  local_a58._52_4_ = 0;
                  local_a58._56_5_ = 0;
                  local_a58._61_3_ = 0;
                  local_a58._64_4_ = 0;
                  local_a58[0x44] = false;
                  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                            ((cpp_dec_float<100u,int,void> *)local_a58,
                             RVar3 * local_8c8 + (1.0 - RVar3) * local_998);
                  if (&local_9f8 != this_00) {
                    local_9f8.data._M_elems._0_8_ = *(undefined8 *)(this_00->data)._M_elems;
                    local_9f8.data._M_elems._8_8_ = *(undefined8 *)((this_00->data)._M_elems + 2);
                    local_9f8.data._M_elems._16_8_ = *(undefined8 *)((this_00->data)._M_elems + 4);
                    local_9f8.data._M_elems._24_8_ = *(undefined8 *)((this_00->data)._M_elems + 6);
                    local_9f8.data._M_elems._32_8_ = *(undefined8 *)((this_00->data)._M_elems + 8);
                    local_9f8.data._M_elems._40_8_ = *(undefined8 *)((this_00->data)._M_elems + 10);
                    local_9f8.data._M_elems._48_8_ = *(undefined8 *)((this_00->data)._M_elems + 0xc)
                    ;
                    uVar4 = *(undefined8 *)((this_00->data)._M_elems + 0xe);
                    local_9f8.data._M_elems._56_5_ = SUB85(uVar4,0);
                    local_9f8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                    local_9f8.exp = this_00->exp;
                    local_9f8.neg = this_00->neg;
                    local_9f8.fpclass = this_00->fpclass;
                    local_9f8.prec_elem = this_00->prec_elem;
                  }
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_9f8,(cpp_dec_float<100U,_int,_void> *)local_a58);
                  pnVar19 = (local_8d8->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  puVar1 = (uint *)((long)&pnVar19[lVar17].m_backend.data + 0x30);
                  *(undefined8 *)puVar1 = local_9f8.data._M_elems._48_8_;
                  *(ulong *)(puVar1 + 2) =
                       CONCAT35(local_9f8.data._M_elems[0xf]._1_3_,local_9f8.data._M_elems._56_5_);
                  puVar1 = (uint *)((long)&pnVar19[lVar17].m_backend.data + 0x20);
                  *(undefined8 *)puVar1 = local_9f8.data._M_elems._32_8_;
                  *(undefined8 *)(puVar1 + 2) = local_9f8.data._M_elems._40_8_;
                  puVar1 = (uint *)((long)&pnVar19[lVar17].m_backend.data + 0x10);
                  *(undefined8 *)puVar1 = local_9f8.data._M_elems._16_8_;
                  *(undefined8 *)(puVar1 + 2) = local_9f8.data._M_elems._24_8_;
                  *(undefined8 *)&pnVar19[lVar17].m_backend.data = local_9f8.data._M_elems._0_8_;
                  *(undefined8 *)((long)&pnVar19[lVar17].m_backend.data + 8) =
                       local_9f8.data._M_elems._8_8_;
                  pnVar19[lVar17].m_backend.exp = local_9f8.exp;
                  pnVar19[lVar17].m_backend.neg = local_9f8.neg;
                  pnVar19[lVar17].m_backend.fpclass = local_9f8.fpclass;
                  pnVar19[lVar17].m_backend.prec_elem = local_9f8.prec_elem;
                  pnVar19 = (local_8d8->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar17;
                  local_a10 = 3.39519326554444e-313;
                  local_a58._0_4_ = 0;
                  local_a58._4_4_ = 0;
                  local_a58._8_4_ = 0;
                  local_a58._12_4_ = 0;
                  local_a58._16_4_ = 0;
                  local_a58._20_4_ = 0;
                  local_a58._24_4_ = 0;
                  local_a58._28_4_ = 0;
                  local_a58._32_4_ = 0;
                  local_a58._36_4_ = 0;
                  local_a58._40_4_ = 0;
                  local_a58._44_4_ = 0;
                  local_a58._48_4_ = 0;
                  local_a58._52_4_ = 0;
                  local_a58._56_5_ = 0;
                  local_a58._61_3_ = 0;
                  local_a58._64_4_ = 0;
                  local_a58[0x44] = false;
                  if ((pointer)local_a58 != pnVar19) {
                    local_a58._0_8_ = *(undefined8 *)&(pnVar19->m_backend).data;
                    local_a58._8_8_ = *(undefined8 *)((long)&(pnVar19->m_backend).data + 8);
                    local_a58._16_8_ = *(undefined8 *)((long)&(pnVar19->m_backend).data + 0x10);
                    local_a58._24_8_ = *(undefined8 *)((long)&(pnVar19->m_backend).data + 0x18);
                    local_a58._32_8_ = *(undefined8 *)((long)&(pnVar19->m_backend).data + 0x20);
                    local_a58._40_8_ = *(undefined8 *)((long)&(pnVar19->m_backend).data + 0x28);
                    local_a58._48_8_ = *(undefined8 *)((long)&(pnVar19->m_backend).data + 0x30);
                    uVar4 = *(undefined8 *)((long)&(pnVar19->m_backend).data + 0x38);
                    local_a58._56_5_ = (undefined5)uVar4;
                    local_a58._61_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                    local_a58._64_4_ = (pnVar19->m_backend).exp;
                    local_a58[0x44] = (pnVar19->m_backend).neg;
                    local_a10 = *(double *)&(pnVar19->m_backend).fpclass;
                  }
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            ((cpp_dec_float<100U,_int,_void> *)local_a58,
                             (cpp_dec_float<100U,_int,_void> *)local_988);
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (local_8e8,(cpp_dec_float<100U,_int,_void> *)local_a58);
                }
              }
            }
          }
        }
        else {
          iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             ((cpp_dec_float<100U,_int,_void> *)local_8b8,&eps->m_backend);
          if (iVar14 < 1) {
            fVar15 = (eps->m_backend).fpclass;
            goto LAB_003d9180;
          }
          local_3a8._61_3_ = local_938._61_3_;
          local_3a8._56_5_ = local_938._56_5_;
          local_3a8._48_8_ = local_938._48_8_;
          local_3a8._32_8_ = local_938._32_8_;
          local_3a8._40_8_ = local_938._40_8_;
          local_3a8._16_8_ = local_938._16_8_;
          local_3a8._24_8_ = local_938._24_8_;
          local_3a8._0_8_ = local_938._0_8_;
          local_3a8._8_8_ = local_938._8_8_;
          local_3a8._64_4_ = local_938._64_4_;
          local_3a8[0x44] = local_938[0x44];
          local_3a8._72_8_ = local_8f0;
          ::soplex::infinity::__tls_init();
          local_e0 = 0x1000000000;
          local_128 = 0;
          uStack_120 = 0;
          local_118 = 0;
          uStack_110 = 0;
          local_108 = 0;
          uStack_100 = 0;
          local_f8 = 0;
          uStack_f0 = 0;
          uStack_eb = 0;
          uStack_e8 = 0;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_128,(double)local_858);
          local_3f8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
          local_3f8.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 2);
          local_3f8.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 4);
          local_3f8.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 6);
          local_3f8.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 8);
          local_3f8.m_backend.data._M_elems._40_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 10);
          local_3f8.m_backend.data._M_elems._48_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
          local_3f8.m_backend.data._M_elems._56_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
          local_3f8.m_backend.exp = (eps->m_backend).exp;
          local_3f8.m_backend.neg = (eps->m_backend).neg;
          local_3f8.m_backend.fpclass = (eps->m_backend).fpclass;
          local_3f8.m_backend.prec_elem = (eps->m_backend).prec_elem;
          bVar13 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)local_3a8,
                              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_128,&local_3f8);
          if (bVar13) {
            local_448._61_3_ = local_988._61_3_;
            local_448._56_5_ = local_988._56_5_;
            local_448._48_8_ = local_988._48_8_;
            local_448._32_8_ = local_988._32_8_;
            local_448._40_8_ = local_988._40_8_;
            local_448._16_8_ = local_988._16_8_;
            local_448._24_8_ = local_988._24_8_;
            local_448._0_8_ = local_988._0_8_;
            local_448._8_8_ = local_988._8_8_;
            local_448._64_4_ = local_988._64_4_;
            local_448[0x44] = local_988[0x44];
            local_448._72_8_ = local_940;
            local_498._61_3_ = local_938._61_3_;
            local_498._56_5_ = local_938._56_5_;
            local_498._0_8_ = local_938._0_8_;
            local_498._8_8_ = local_938._8_8_;
            local_498._16_8_ = local_938._16_8_;
            local_498._24_8_ = local_938._24_8_;
            local_498._32_8_ = local_938._32_8_;
            local_498._40_8_ = local_938._40_8_;
            local_498._48_8_ = local_938._48_8_;
            local_498._64_4_ = local_938._64_4_;
            local_498[0x44] = local_938[0x44];
            local_498._72_8_ = local_8f0;
            local_4e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
            local_4e8.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 2);
            local_4e8.m_backend.data._M_elems._16_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 4);
            local_4e8.m_backend.data._M_elems._24_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 6);
            local_4e8.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 8);
            local_4e8.m_backend.data._M_elems._40_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 10);
            local_4e8.m_backend.data._M_elems._48_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
            local_4e8.m_backend.data._M_elems._56_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
            local_4e8.m_backend.exp = (eps->m_backend).exp;
            local_4e8.m_backend.neg = (eps->m_backend).neg;
            local_4e8.m_backend.fpclass = (eps->m_backend).fpclass;
            local_4e8.m_backend.prec_elem = (eps->m_backend).prec_elem;
            bVar13 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)local_448,
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)local_498,&local_4e8);
            if (bVar13) {
              local_a10 = 3.39519326554444e-313;
              local_a58._0_4_ = 0;
              local_a58._4_4_ = 0;
              local_a58._8_4_ = 0;
              local_a58._12_4_ = 0;
              local_a58._16_4_ = 0;
              local_a58._20_4_ = 0;
              local_a58._24_4_ = 0;
              local_a58._28_4_ = 0;
              local_a58._32_4_ = 0;
              local_a58._36_4_ = 0;
              local_a58._40_4_ = 0;
              local_a58._44_4_ = 0;
              local_a58._48_4_ = 0;
              local_a58._52_4_ = 0;
              local_a58._56_5_ = 0;
              local_a58._61_3_ = 0;
              local_a58._64_4_ = 0;
              local_a58[0x44] = false;
              if ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_a58 == eps) {
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          ((cpp_dec_float<100U,_int,_void> *)local_a58,
                           (cpp_dec_float<100U,_int,_void> *)local_938);
                fVar15 = cpp_dec_float_finite;
                if (local_a58._0_4_ != 0 || (fpclass_type)local_a10 != cpp_dec_float_finite) {
                  local_a58[0x44] = local_a58[0x44] ^ 1;
                  fVar15 = (fpclass_type)local_a10;
                }
              }
              else {
                local_a58._48_8_ = local_938._48_8_;
                local_a58._56_5_ = local_938._56_5_;
                local_a58._61_3_ = local_938._61_3_;
                local_a58._32_8_ = local_938._32_8_;
                local_a58._40_8_ = local_938._40_8_;
                local_a58._16_8_ = local_938._16_8_;
                local_a58._24_8_ = local_938._24_8_;
                local_a58._0_8_ = local_938._0_8_;
                local_a58._8_8_ = local_938._8_8_;
                local_a58._64_4_ = local_938._64_4_;
                local_a58[0x44] = local_938[0x44];
                local_a10 = local_8f0;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          ((cpp_dec_float<100U,_int,_void> *)local_a58,&eps->m_backend);
                fVar15 = (fpclass_type)local_a10;
              }
              pcVar18 = &pnVar2[(long)local_998].m_backend;
              if ((((pcVar18->fpclass != cpp_dec_float_NaN) && (fVar15 != cpp_dec_float_NaN)) &&
                  (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                      (pcVar18,(cpp_dec_float<100U,_int,_void> *)local_a58),
                  -1 < iVar14)) && (stat[(long)local_998] * local_9a0->theRep < 0)) {
                local_998 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                            extract_double(&local_7e8);
                local_8c8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                            extract_double(&local_838);
                RVar3 = Random::next_random(local_8e0);
                local_9f8.fpclass = cpp_dec_float_finite;
                local_9f8.prec_elem = 0x10;
                local_9f8.data._M_elems[0] = 0;
                local_9f8.data._M_elems[1] = 0;
                local_9f8.data._M_elems[2] = 0;
                local_9f8.data._M_elems[3] = 0;
                local_9f8.data._M_elems[4] = 0;
                local_9f8.data._M_elems[5] = 0;
                local_9f8.data._M_elems[6] = 0;
                local_9f8.data._M_elems[7] = 0;
                local_9f8.data._M_elems[8] = 0;
                local_9f8.data._M_elems[9] = 0;
                local_9f8.data._M_elems[10] = 0;
                local_9f8.data._M_elems[0xb] = 0;
                local_9f8.data._M_elems[0xc] = 0;
                local_9f8.data._M_elems[0xd] = 0;
                local_9f8.data._M_elems._56_5_ = 0;
                local_9f8.data._M_elems[0xf]._1_3_ = 0;
                local_9f8.exp = 0;
                local_9f8.neg = false;
                local_a10._0_4_ = cpp_dec_float_finite;
                local_a10._4_4_ = 0x10;
                local_a58._0_4_ = 0;
                local_a58._4_4_ = 0;
                local_a58._8_4_ = 0;
                local_a58._12_4_ = 0;
                local_a58._16_4_ = 0;
                local_a58._20_4_ = 0;
                local_a58._24_4_ = 0;
                local_a58._28_4_ = 0;
                local_a58._32_4_ = 0;
                local_a58._36_4_ = 0;
                local_a58._40_4_ = 0;
                local_a58._44_4_ = 0;
                local_a58._48_4_ = 0;
                local_a58._52_4_ = 0;
                local_a58._56_5_ = 0;
                local_a58._61_3_ = 0;
                local_a58._64_4_ = 0;
                local_a58[0x44] = false;
                boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                          ((cpp_dec_float<100u,int,void> *)local_a58,
                           RVar3 * local_8c8 + (1.0 - RVar3) * local_998);
                if (&local_9f8 != pcVar18) {
                  local_9f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar18->data)._M_elems;
                  local_9f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 2);
                  local_9f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 4);
                  local_9f8.data._M_elems._24_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 6);
                  local_9f8.data._M_elems._32_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 8);
                  local_9f8.data._M_elems._40_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 10);
                  local_9f8.data._M_elems._48_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
                  uVar4 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
                  local_9f8.data._M_elems._56_5_ = SUB85(uVar4,0);
                  local_9f8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                  local_9f8.exp = pcVar18->exp;
                  local_9f8.neg = pcVar18->neg;
                  local_9f8.fpclass = pcVar18->fpclass;
                  local_9f8.prec_elem = pcVar18->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (&local_9f8,(cpp_dec_float<100U,_int,_void> *)local_a58);
                pnVar19 = (local_8d0->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar1 = (uint *)((long)&pnVar19[lVar17].m_backend.data + 0x30);
                *(undefined8 *)puVar1 = local_9f8.data._M_elems._48_8_;
                *(ulong *)(puVar1 + 2) =
                     CONCAT35(local_9f8.data._M_elems[0xf]._1_3_,local_9f8.data._M_elems._56_5_);
                puVar1 = (uint *)((long)&pnVar19[lVar17].m_backend.data + 0x20);
                *(undefined8 *)puVar1 = local_9f8.data._M_elems._32_8_;
                *(undefined8 *)(puVar1 + 2) = local_9f8.data._M_elems._40_8_;
                puVar1 = (uint *)((long)&pnVar19[lVar17].m_backend.data + 0x10);
                *(undefined8 *)puVar1 = local_9f8.data._M_elems._16_8_;
                *(undefined8 *)(puVar1 + 2) = local_9f8.data._M_elems._24_8_;
                *(undefined8 *)&pnVar19[lVar17].m_backend.data = local_9f8.data._M_elems._0_8_;
                *(undefined8 *)((long)&pnVar19[lVar17].m_backend.data + 8) =
                     local_9f8.data._M_elems._8_8_;
                pnVar19[lVar17].m_backend.exp = local_9f8.exp;
                pnVar19[lVar17].m_backend.neg = local_9f8.neg;
                pnVar19[lVar17].m_backend.fpclass = local_9f8.fpclass;
                pnVar19[lVar17].m_backend.prec_elem = local_9f8.prec_elem;
                pnVar19 = (local_8d0->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar17;
                local_a10 = 3.39519326554444e-313;
                local_a58._0_4_ = 0;
                local_a58._4_4_ = 0;
                local_a58._8_4_ = 0;
                local_a58._12_4_ = 0;
                local_a58._16_4_ = 0;
                local_a58._20_4_ = 0;
                local_a58._24_4_ = 0;
                local_a58._28_4_ = 0;
                local_a58._32_4_ = 0;
                local_a58._36_4_ = 0;
                local_a58._40_4_ = 0;
                local_a58._44_4_ = 0;
                local_a58._48_4_ = 0;
                local_a58._52_4_ = 0;
                local_a58._56_5_ = 0;
                local_a58._61_3_ = 0;
                local_a58._64_4_ = 0;
                local_a58[0x44] = false;
                if ((pointer)local_a58 != pnVar19) {
                  local_a58._0_8_ = *(undefined8 *)&(pnVar19->m_backend).data;
                  local_a58._8_8_ = *(undefined8 *)((long)&(pnVar19->m_backend).data + 8);
                  local_a58._16_8_ = *(undefined8 *)((long)&(pnVar19->m_backend).data + 0x10);
                  local_a58._24_8_ = *(undefined8 *)((long)&(pnVar19->m_backend).data + 0x18);
                  local_a58._32_8_ = *(undefined8 *)((long)&(pnVar19->m_backend).data + 0x20);
                  local_a58._40_8_ = *(undefined8 *)((long)&(pnVar19->m_backend).data + 0x28);
                  local_a58._48_8_ = *(undefined8 *)((long)&(pnVar19->m_backend).data + 0x30);
                  uVar4 = *(undefined8 *)((long)&(pnVar19->m_backend).data + 0x38);
                  local_a58._56_5_ = (undefined5)uVar4;
                  local_a58._61_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                  local_a58._64_4_ = (pnVar19->m_backend).exp;
                  local_a58[0x44] = (pnVar19->m_backend).neg;
                  local_a10 = *(double *)&(pnVar19->m_backend).fpclass;
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          ((cpp_dec_float<100U,_int,_void> *)local_a58,
                           (cpp_dec_float<100U,_int,_void> *)local_938);
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (local_8e8,(cpp_dec_float<100U,_int,_void> *)local_a58);
              }
            }
          }
        }
        uVar20 = uVar20 - incr;
      } while (-1 < (int)uVar20);
    }
  }
  return (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)local_8e8;
}

Assistant:

R SPxSolverBase<R>::perturbMax(
   const UpdateVector<R>& uvec,
   VectorBase<R>& p_low,
   VectorBase<R>& p_up,
   R eps,
   R p_delta,
   const typename SPxBasisBase<R>::Desc::Status* stat,
   int start,
   int incr)
{
   assert(uvec.dim() == p_low.dim());
   assert(uvec.dim() == p_up.dim());

   const R* vec = uvec.get_const_ptr();
   R minrandom = 10.0 * p_delta;
   R maxrandom = 100.0 * p_delta;
   R x, l, u;
   int i;
   R l_theShift = 0;

   if(fullPerturbation)
   {
      eps = p_delta;

      for(i = uvec.dim() - start - 1; i >= 0; i -= incr)
      {
         u = p_up[i];
         l = p_low[i];
         x = vec[i];

         if(LT(u, R(infinity), eps) && NE(l, u, eps) && u <= x + eps && rep() * stat[i] < 0)
         {
            p_up[i] = vec[i] + random.next((double)minrandom, (double)maxrandom);
            l_theShift += p_up[i] - u;
         }

         if(GT(l, R(-infinity), eps) && NE(l, u, eps) && l >= x - eps && rep() * stat[i] < 0)
         {
            p_low[i] = vec[i] - random.next((double)minrandom, (double)maxrandom);
            l_theShift -= p_low[i] - l;
         }
      }
   }
   else
   {
      const R* upd = uvec.delta().values();
      const IdxSet& idx = uvec.delta().indices();

      for(int j = uvec.delta().size() - start - 1; j >= 0; j -= incr)
      {
         i = idx.index(j);
         x = upd[i];
         u = p_up[i];
         l = p_low[i];

         if(x > eps)
         {
            if(LT(u, R(infinity), eps) && NE(l, u, eps) && vec[i] >= u - eps && rep() * stat[i] < 0)
            {
               p_up[i] = vec[i] + random.next((double)minrandom, (double)maxrandom);
               l_theShift += p_up[i] - u;
            }
         }
         else if(x < -eps)
         {
            if(GT(l, R(-infinity), eps) && NE(l, u, eps) && vec[i] <= l + eps && rep() * stat[i] < 0)
            {
               p_low[i] = vec[i] - random.next((double)minrandom, (double)maxrandom);
               l_theShift -= p_low[i] - l;
            }
         }
      }
   }

   return l_theShift;
}